

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.hpp
# Opt level: O3

NotNullConstraint * __thiscall duckdb::Constraint::Cast<duckdb::NotNullConstraint>(Constraint *this)

{
  InternalException *this_00;
  string local_40;
  
  if (this->type == NOT_NULL) {
    return (NotNullConstraint *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Failed to cast constraint to type - constraint type mismatch","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const TARGET &Cast() const {
		if (type != TARGET::TYPE) {
			throw InternalException("Failed to cast constraint to type - constraint type mismatch");
		}
		return reinterpret_cast<const TARGET &>(*this);
	}